

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  node *pnVar1;
  list_iterator tmp_1;
  ostream *poVar2;
  list_iterator tmp;
  char *pcVar3;
  list<int> y;
  list<int> l;
  int local_2c;
  list<int> local_28;
  list<int> local_18;
  
  CP::list<int>::list(&local_18);
  local_28.mHeader._0_4_ = 9;
  CP::list<int>::push_back(&local_18,(int *)&local_28);
  local_28.mHeader._0_4_ = 2;
  CP::list<int>::push_back(&local_18,(int *)&local_28);
  local_28.mHeader._0_4_ = 2;
  CP::list<int>::push_back(&local_18,(int *)&local_28);
  local_28.mHeader._0_4_ = 4;
  CP::list<int>::push_back(&local_18,(int *)&local_28);
  local_28.mHeader._0_4_ = 2;
  CP::list<int>::push_back(&local_18,(int *)&local_28);
  local_28.mHeader._0_4_ = 7;
  CP::list<int>::push_back(&local_18,(int *)&local_28);
  CP::list<int>::list(&local_28);
  local_2c = 3;
  CP::list<int>::push_back(&local_28,&local_2c);
  local_2c = 2;
  CP::list<int>::push_back(&local_28,&local_2c);
  local_2c = 1;
  CP::list<int>::push_back(&local_28,&local_2c);
  local_2c = 2;
  CP::list<int>::replace(&local_18,&local_2c,&local_28);
  pnVar1 = (local_18.mHeader)->next;
  CP::list<int>::print(&local_18);
  pcVar3 = "Wrong";
  if (((((pnVar1->data == 9) && (pnVar1 = pnVar1->next, pnVar1->data == 3)) &&
       (pnVar1 = pnVar1->next, pnVar1->data == 2)) &&
      ((((pnVar1 = pnVar1->next, pnVar1->data == 1 && (pnVar1 = pnVar1->next, pnVar1->data == 3)) &&
        ((pnVar1 = pnVar1->next, pnVar1->data == 2 &&
         ((pnVar1 = pnVar1->next, pnVar1->data == 1 && (pnVar1 = pnVar1->next, pnVar1->data == 4))))
        )) && (pnVar1 = pnVar1->next, pnVar1->data == 3)))) &&
     (((pnVar1 = pnVar1->next, pnVar1->data == 2 && (pnVar1 = pnVar1->next, pnVar1->data == 1)) &&
      (pcVar3 = "Wrong", pnVar1->next->data == 7)))) {
    pcVar3 = "Right";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  CP::list<int>::~list(&local_28);
  CP::list<int>::~list(&local_18);
  return 0;
}

Assistant:

int main() {
	CP::list<int> l;
	l.push_back(9);
	l.push_back(2);
	l.push_back(2);
	l.push_back(4);
	l.push_back(2);
	l.push_back(7);
	CP::list<int> y;
	y.push_back(3);
	y.push_back(2);
	y.push_back(1);

	l.replace(2, y);
	CP::list<int>::iterator it = l.begin();
	l.print();
	if ((*it++ == 9) && (*it++ == 3) && (*it++ == 2) && (*it++ == 1) && (*it++ == 3) && (*it++ == 2) && (*it++ == 1) && (*it++ == 4) &&
		(*it++ == 3) && (*it++ == 2) && (*it++ == 1) && (*it++ == 7)) {
		std::cout << "Right" << std::endl;
	}
	else {
		std::cout << "Wrong" << std::endl;
	}

	return 0;
}